

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O2

X509CertificateExtension *
QTlsPrivate::X509CertificateOpenSSL::convertExtension
          (X509CertificateExtension *__return_storage_ptr__,X509_EXTENSION *ext)

{
  qsizetype qVar1;
  int *piVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ASN1_OBJECT *pAVar12;
  X509V3_EXT_METHOD *pXVar13;
  BASIC_CONSTRAINTS *a;
  QVariant *pQVar14;
  long lVar15;
  OPENSSL_STACK *a_00;
  undefined8 *puVar16;
  QDebug *this;
  AUTHORITY_KEYID *a_01;
  ASN1_VALUE *pAVar17;
  stack_st_CONF_VALUE *a_02;
  void *pvVar18;
  ASN1_OCTET_STRING *pAVar19;
  uchar *puVar20;
  BIO_METHOD *a_03;
  BIO *a_04;
  ASN1_ITEM *pAVar21;
  QLoggingCategory *pQVar22;
  bool bVar23;
  int i;
  storage_type *psVar24;
  int j;
  QByteArrayView *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView local_110;
  QByteArrayView local_100;
  QByteArrayView local_f0;
  char *hexString_1;
  char *hexString;
  char *bio_buffer;
  QVariant *pQStack_b0;
  qsizetype local_a8;
  QMap<QString,_QVariant> local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 uStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  ulong uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->critical = true;
  __return_storage_ptr__->supported = true;
  *(undefined6 *)&__return_storage_ptr__->field_0x52 = 0xaaaaaaaaaaaa;
  (__return_storage_ptr__->oid).d.d = (Data *)0x0;
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->oid).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->value).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).d.data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->value).d.field_0x18 = 2;
  __return_storage_ptr__->critical = false;
  __return_storage_ptr__->supported = false;
  pAVar12 = q_X509_EXTENSION_get_object(ext);
  if (pAVar12 == (ASN1_OBJECT *)0x0) goto LAB_0011db38;
  anon_unknown_2::asn1ObjectId((QByteArray *)&local_78,pAVar12);
  QString::fromUtf8<void>((QString *)&local_58,(QByteArray *)&local_78);
  pDVar3 = (__return_storage_ptr__->oid).d.d;
  pcVar4 = (__return_storage_ptr__->oid).d.ptr;
  (__return_storage_ptr__->oid).d.d = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
  (__return_storage_ptr__->oid).d.ptr = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
  local_58._0_4_ = SUB84(pDVar3,0);
  local_58._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
  local_58._8_4_ = SUB84(pcVar4,0);
  local_58._12_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
  qVar1 = (__return_storage_ptr__->oid).d.size;
  (__return_storage_ptr__->oid).d.size = CONCAT44(local_58._20_4_,local_58._16_4_);
  local_58._16_4_ = (undefined4)qVar1;
  local_58._20_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  anon_unknown_2::asn1ObjectName((QByteArray *)&local_78,pAVar12);
  QString::fromUtf8<void>((QString *)&local_58,(QByteArray *)&local_78);
  pDVar3 = (__return_storage_ptr__->name).d.d;
  pcVar4 = (__return_storage_ptr__->name).d.ptr;
  (__return_storage_ptr__->name).d.d = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
  (__return_storage_ptr__->name).d.ptr = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
  local_58._0_4_ = SUB84(pDVar3,0);
  local_58._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
  local_58._8_4_ = SUB84(pcVar4,0);
  local_58._12_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
  qVar1 = (__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = CONCAT44(local_58._20_4_,local_58._16_4_);
  local_58._16_4_ = (undefined4)qVar1;
  local_58._20_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  iVar9 = q_X509_EXTENSION_get_critical(ext);
  __return_storage_ptr__->critical = iVar9 != 0;
  local_78._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_78._8_8_ = 0xaaaaaaaaaaaaaaaa;
  pAVar12 = q_X509_EXTENSION_get_object(ext);
  iVar9 = q_OBJ_obj2nid(pAVar12);
  pXVar13 = q_X509V3_EXT_get(ext);
  hexString = (char *)0x0;
  if (iVar9 == 0x52) {
    pAVar17 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
    if (pAVar17 == (ASN1_VALUE *)0x0) goto LAB_0011d589;
    hexString = (*pXVar13->i2s)(pXVar13,pAVar17);
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_98,&hexString);
    QVar25.m_data = (storage_type *)local_98.shared;
    QVar25.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar25);
    QVariant::QVariant((QVariant *)&local_78,(QString *)local_58.data);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    if (hexString != (char *)0x0) {
      q_CRYPTO_free(hexString,"",0);
    }
    if (pXVar13->it == (ASN1_ITEM_EXP *)0x0) {
      if (pXVar13->ext_free == (X509V3_EXT_FREE)0x0) {
        pQVar22 = lcTlsBackend();
        if (((pQVar22->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_40 = pQVar22->name;
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          QMessageLogger::warning
                    ((char *)local_58.data,"Cannot free an extension, a potential memory leak?");
        }
      }
      else {
        (*pXVar13->ext_free)(pAVar17);
      }
    }
    else {
      pAVar21 = (*pXVar13->it)();
      q_ASN1_item_free(pAVar17,pAVar21);
    }
  }
  else if (iVar9 == 0xb1) {
    a_00 = (OPENSSL_STACK *)q_X509V3_EXT_d2i(ext);
    if (a_00 == (OPENSSL_STACK *)0x0) goto LAB_0011d589;
    local_f0.m_size = 0;
    for (iVar9 = 0; iVar11 = q_OPENSSL_sk_num(a_00), iVar9 < iVar11; iVar9 = iVar9 + 1) {
      puVar16 = (undefined8 *)q_OPENSSL_sk_value(a_00,iVar9);
      piVar2 = (int *)puVar16[1];
      if (*piVar2 == 6) {
        uVar10 = q_ASN1_STRING_length(*(ASN1_STRING **)(piVar2 + 2));
        if (uVar10 < 0x2000) {
          puVar20 = q_ASN1_STRING_get0_data(*(ASN1_STRING **)(piVar2 + 2));
          local_98._16_8_ = 0xaaaaaaaaaaaaaaaa;
          local_98.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_98._8_8_ = 0xaaaaaaaaaaaaaaaa;
          QString::fromUtf8((QString *)&local_98,(char *)puVar20,(ulong)uVar10);
          QVariant::QVariant((QVariant *)&local_58,(QString *)local_98.data);
          anon_unknown_2::asn1ObjectName((QByteArray *)&hexString_1,(ASN1_OBJECT *)*puVar16);
          QString::fromUtf8<void>((QString *)&bio_buffer,(QByteArray *)&hexString_1);
          pQVar14 = QMap<QString,_QVariant>::operator[]
                              ((QMap<QString,_QVariant> *)&local_f0,(QString *)&bio_buffer);
          QVariant::operator=(pQVar14,(QVariant *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&bio_buffer);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&hexString_1);
          QVariant::~QVariant((QVariant *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        }
      }
      else {
        pQVar22 = lcTlsBackend();
        if (((pQVar22->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_40 = pQVar22->name;
          local_58._0_4_ = 2;
          local_58._4_4_ = 0;
          local_58._8_4_ = 0;
          local_58._12_4_ = 0;
          local_58._16_4_ = 0;
          local_58._20_4_ = 0;
          QMessageLogger::warning();
          this = QDebug::operator<<((QDebug *)local_98.data,"Strange location type");
          QDebug::operator<<(this,*piVar2);
          QDebug::~QDebug((QDebug *)local_98.data);
        }
      }
    }
    q_AUTHORITY_INFO_ACCESS_free((AUTHORITY_INFO_ACCESS *)a_00);
    QVariant::QVariant((QVariant *)&local_78,(QMap *)&local_f0);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)&local_f0);
  }
  else {
    if (iVar9 == 0x5a) {
      a_01 = (AUTHORITY_KEYID *)q_X509V3_EXT_d2i(ext);
      if (a_01 != (AUTHORITY_KEYID *)0x0) {
        local_f0.m_size = 0;
        pAVar19 = a_01->keyid;
        if (pAVar19 != (ASN1_OCTET_STRING *)0x0) {
          local_98._16_8_ = 0xaaaaaaaaaaaaaaaa;
          local_98.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_98._8_8_ = 0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)&local_98,(char *)pAVar19->data,(long)pAVar19->length);
          QByteArray::toHex((char)(QByteArray *)&bio_buffer);
          QVariant::QVariant((QVariant *)&local_58,(QByteArray *)&bio_buffer);
          latin1_01.m_data = "keyid";
          latin1_01.m_size = 5;
          QString::QString((QString *)&hexString_1,latin1_01);
          pQVar14 = QMap<QString,_QVariant>::operator[]
                              ((QMap<QString,_QVariant> *)&local_f0,(QString *)&hexString_1);
          QVariant::operator=(pQVar14,(QVariant *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&hexString_1);
          QVariant::~QVariant((QVariant *)&local_58);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&bio_buffer);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
        }
        if (a_01->serial != (ASN1_INTEGER *)0x0) {
          lVar15 = q_ASN1_INTEGER_get(a_01->serial);
          QVariant::QVariant((QVariant *)&local_58,lVar15);
          latin1_02.m_data = "serial";
          latin1_02.m_size = 6;
          QString::QString((QString *)&local_98,latin1_02);
          pQVar14 = QMap<QString,_QVariant>::operator[]
                              ((QMap<QString,_QVariant> *)&local_f0,(QString *)&local_98);
          QVariant::operator=(pQVar14,(QVariant *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
          QVariant::~QVariant((QVariant *)&local_58);
        }
        q_AUTHORITY_KEYID_free(a_01);
        this_00 = &local_f0;
        goto LAB_0011d4d1;
      }
    }
    else if ((iVar9 == 0x57) &&
            (a = (BASIC_CONSTRAINTS *)q_X509V3_EXT_d2i(ext), a != (BASIC_CONSTRAINTS *)0x0)) {
      bio_buffer = (char *)0x0;
      QVariant::QVariant((QVariant *)&local_58,a->ca != 0);
      latin1.m_data = "ca";
      latin1.m_size = 2;
      QString::QString((QString *)&local_98,latin1);
      pQVar14 = QMap<QString,_QVariant>::operator[]
                          ((QMap<QString,_QVariant> *)&bio_buffer,(QString *)&local_98);
      QVariant::operator=(pQVar14,(QVariant *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QVariant::~QVariant((QVariant *)&local_58);
      if (a->pathlen != (ASN1_INTEGER *)0x0) {
        lVar15 = q_ASN1_INTEGER_get(a->pathlen);
        QVariant::QVariant((QVariant *)&local_58,lVar15);
        latin1_00.m_data = "pathLenConstraint";
        latin1_00.m_size = 0x11;
        QString::QString((QString *)&local_98,latin1_00);
        pQVar14 = QMap<QString,_QVariant>::operator[]
                            ((QMap<QString,_QVariant> *)&bio_buffer,(QString *)&local_98);
        QVariant::operator=(pQVar14,(QVariant *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QVariant::~QVariant((QVariant *)&local_58);
      }
      q_BASIC_CONSTRAINTS_free(a);
      this_00 = (QByteArrayView *)&bio_buffer;
LAB_0011d4d1:
      QVariant::QVariant((QVariant *)&local_78,(QMap *)this_00);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)this_00);
      goto LAB_0011d5da;
    }
LAB_0011d589:
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    uStack_60 = 2;
  }
LAB_0011d5da:
  bVar8 = true;
  if (uStack_60 < 4) {
    pXVar13 = q_X509V3_EXT_get(ext);
    if (pXVar13 == (X509V3_EXT_METHOD *)0x0) {
      pAVar19 = q_X509_EXTENSION_get_data(ext);
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      puVar20 = q_ASN1_STRING_get0_data(pAVar19);
      iVar9 = q_ASN1_STRING_length(pAVar19);
      QByteArray::QByteArray((QByteArray *)&local_58,(char *)puVar20,(long)iVar9);
      QVariant::QVariant((QVariant *)&local_98,(QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    }
    else {
      pAVar17 = (ASN1_VALUE *)q_X509V3_EXT_d2i(ext);
      if (pAVar17 == (ASN1_VALUE *)0x0) {
        local_98.shared = (PrivateShared *)0x0;
        local_98._8_8_ = 0;
        local_98._16_8_ = 0;
        uStack_80 = 2;
      }
      else {
        if (pXVar13->i2v == (X509V3_EXT_I2V)0x0) {
          if (pXVar13->i2s == (X509V3_EXT_I2S)0x0) {
            if (pXVar13->i2r == (X509V3_EXT_I2R)0x0) {
              local_98.shared = (PrivateShared *)0x0;
              local_98._8_8_ = 0;
              local_98._16_8_ = 0;
              uStack_80 = 2;
            }
            else {
              local_58._0_4_ = 0;
              local_58._4_4_ = 0;
              local_58._8_4_ = 0;
              local_58._12_4_ = 0;
              local_58._16_4_ = 0;
              local_58._20_4_ = 0;
              a_03 = q_BIO_s_mem();
              a_04 = q_BIO_new(a_03);
              if (a_04 != (BIO *)0x0) {
                (*pXVar13->i2r)(pXVar13,pAVar17,a_04,0);
                bio_buffer = (char *)0xaaaaaaaaaaaaaaaa;
                lVar15 = q_BIO_ctrl(a_04,3,0,&bio_buffer);
                QByteArray::QByteArray((QByteArray *)&local_98,bio_buffer,(long)(int)lVar15);
                pPVar5 = (PrivateShared *)CONCAT44(local_58._4_4_,local_58._0_4_);
                uVar6 = CONCAT44(local_58._12_4_,local_58._8_4_);
                local_58._0_4_ = SUB84(local_98.shared,0);
                local_58._4_4_ = (undefined4)((ulong)local_98._0_8_ >> 0x20);
                local_58._8_4_ = (undefined4)local_98._8_8_;
                local_58._12_4_ = (undefined4)((ulong)local_98._8_8_ >> 0x20);
                uVar7 = CONCAT44(local_58._20_4_,local_58._16_4_);
                local_58._16_4_ = (undefined4)local_98._16_8_;
                local_58._20_4_ = (undefined4)((ulong)local_98._16_8_ >> 0x20);
                local_98.shared = pPVar5;
                local_98._8_8_ = uVar6;
                local_98._16_8_ = uVar7;
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
                q_BIO_free(a_04);
              }
              QVariant::QVariant((QVariant *)&local_98,(QByteArray *)&local_58);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
            }
          }
          else {
            hexString_1 = (*pXVar13->i2s)(pXVar13,pAVar17);
            local_98.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
            local_98._8_8_ = 0xaaaaaaaaaaaaaaaa;
            local_98._16_8_ = 0xaaaaaaaaaaaaaaaa;
            uStack_80 = 0xaaaaaaaaaaaaaaaa;
            if (hexString_1 == (char *)0x0) {
              local_58._0_4_ = 0;
              local_58._4_4_ = 0;
              local_58._8_4_ = 0;
              local_58._12_4_ = 0;
              local_58._16_4_ = 0;
              local_58._20_4_ = 0;
            }
            else {
              QByteArrayView::QByteArrayView<const_char_*,_true>
                        ((QByteArrayView *)&bio_buffer,&hexString_1);
              QVar29.m_data = bio_buffer;
              QVar29.m_size = (qsizetype)&local_58;
              QString::fromUtf8(QVar29);
            }
            QVariant::QVariant((QVariant *)&local_98,(QString *)local_58.data);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
            q_CRYPTO_free(hexString_1,"",0);
          }
        }
        else {
          a_02 = (*pXVar13->i2v)(pXVar13,pAVar17,(stack_st_CONF_VALUE *)0x0);
          local_a0.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
                  )0x0;
          bio_buffer = (char *)0x0;
          pQStack_b0 = (QVariant *)0x0;
          local_a8 = 0;
          bVar8 = false;
          for (iVar9 = 0; iVar11 = q_OPENSSL_sk_num((OPENSSL_STACK *)a_02), iVar9 < iVar11;
              iVar9 = iVar9 + 1) {
            pvVar18 = q_OPENSSL_sk_value((OPENSSL_STACK *)a_02,iVar9);
            if (*(long *)((long)pvVar18 + 8) == 0) {
              if (*(long *)((long)pvVar18 + 0x10) != 0) {
                QByteArrayView::QByteArrayView<char_*,_true>
                          (&local_110,(char **)((long)pvVar18 + 0x10));
                psVar24 = (storage_type *)local_110.m_size;
                goto LAB_0011d76b;
              }
            }
            else if (*(long *)((long)pvVar18 + 0x10) == 0) {
              QByteArrayView::QByteArrayView<char_*,_true>(&local_100,(char **)((long)pvVar18 + 8));
              psVar24 = (storage_type *)local_100.m_size;
LAB_0011d76b:
              QVar28.m_data = psVar24;
              QVar28.m_size = (qsizetype)&local_98;
              QString::fromUtf8(QVar28);
              QVariant::QVariant((QVariant *)&local_58,(QString *)local_98.data);
              QList<QVariant>::emplaceBack<QVariant>
                        ((QList<QVariant> *)&bio_buffer,(QVariant *)&local_58);
              QVariant::~QVariant((QVariant *)&local_58);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_98);
            }
            else {
              QByteArrayView::QByteArrayView<char_*,_true>
                        ((QByteArrayView *)&hexString,(char **)((long)pvVar18 + 0x10));
              QVar26.m_data = hexString;
              QVar26.m_size = (qsizetype)&local_98;
              QString::fromUtf8(QVar26);
              QVariant::QVariant((QVariant *)&local_58,(QString *)local_98.data);
              QByteArrayView::QByteArrayView<char_*,_true>(&local_f0,(char **)((long)pvVar18 + 8));
              QVar27.m_data = (storage_type *)local_f0.m_size;
              QVar27.m_size = (qsizetype)&hexString_1;
              QString::fromUtf8(QVar27);
              pQVar14 = QMap<QString,_QVariant>::operator[](&local_a0,(QString *)&hexString_1);
              QVariant::operator=(pQVar14,(QVariant *)&local_58);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&hexString_1);
              QVariant::~QVariant((QVariant *)&local_58);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_98);
              bVar8 = true;
            }
          }
          if (bVar8) {
            QVariant::QVariant((QVariant *)&local_98,(QMap *)&local_a0);
          }
          else {
            QVariant::QVariant((QVariant *)&local_98,(QList *)&bio_buffer);
          }
          QArrayDataPointer<QVariant>::~QArrayDataPointer
                    ((QArrayDataPointer<QVariant> *)&bio_buffer);
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_a0.d);
          if (a_02 != (stack_st_CONF_VALUE *)0x0) {
            q_OPENSSL_sk_pop_free((OPENSSL_STACK *)a_02,q_X509V3_conf_free);
          }
        }
        if (pXVar13->it == (ASN1_ITEM_EXP *)0x0) {
          if (pXVar13->ext_free == (X509V3_EXT_FREE)0x0) {
            pQVar22 = lcTlsBackend();
            if (((pQVar22->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_40 = pQVar22->name;
              local_58._0_4_ = 2;
              local_58._4_4_ = 0;
              local_58._8_4_ = 0;
              local_58._12_4_ = 0;
              local_58._16_4_ = 0;
              local_58._20_4_ = 0;
              QMessageLogger::warning
                        ((char *)local_58.data,
                         "No method to free an unknown extension, a potential memory leak?");
            }
          }
          else {
            (*pXVar13->ext_free)(pAVar17);
          }
        }
        else {
          pAVar21 = (*pXVar13->it)();
          q_ASN1_item_free(pAVar17,pAVar21);
        }
      }
    }
    QVariant::operator=((QVariant *)&local_78,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)&local_98);
    bVar23 = false;
    bVar8 = false;
    if (3 < uStack_60) goto LAB_0011db16;
  }
  else {
LAB_0011db16:
    bVar23 = bVar8;
    QVariant::operator=(&__return_storage_ptr__->value,(QVariant *)&local_78);
  }
  __return_storage_ptr__->supported = bVar23;
  QVariant::~QVariant((QVariant *)&local_78);
LAB_0011db38:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

X509CertificateBase::X509CertificateExtension X509CertificateOpenSSL::convertExtension(X509_EXTENSION *ext)
{
    Q_ASSERT(ext);

    X509CertificateExtension result;

    ASN1_OBJECT *obj = q_X509_EXTENSION_get_object(ext);
    if (!obj)
        return result;

    result.oid = QString::fromUtf8(asn1ObjectId(obj));
    result.name = QString::fromUtf8(asn1ObjectName(obj));

    result.critical = bool(q_X509_EXTENSION_get_critical(ext));

    // Lets see if we have custom support for this one
    QVariant extensionValue = x509ExtensionToValue(ext);
    if (extensionValue.isValid()) {
        result.value = extensionValue;
        result.supported = true;
        return result;
    }

    extensionValue = x509UnknownExtensionToValue(ext);
    if (extensionValue.isValid())
        result.value = extensionValue;

    result.supported = false;

    return result;
}